

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::InnerLoopEmitLog
          (EventLog *this,TTDebuggerSourceLocation *writeLocation,char *emitUri,size_t emitUriLength
          )

{
  uint32 uVar1;
  TTDInnerLoopLogWriteEventLogEntry *pTVar2;
  TTD_LOG_PTR_ID TVar3;
  int64 iVar4;
  undefined1 local_88 [8];
  byte buff [72];
  
  NSLogEvents::EventLogEntry_Initialize<(TTD::NSLogEvents::EventKind)14>
            ((EventLogEntry *)local_88,this->m_eventTimeCtr);
  pTVar2 = NSLogEvents::
           GetInlineEventDataAs<TTD::NSLogEvents::TTDInnerLoopLogWriteEventLogEntry,(TTD::NSLogEvents::EventKind)14>
                     ((EventLogEntry *)local_88);
  TVar3 = TTDebuggerSourceLocation::GetScriptLogTagId(writeLocation);
  pTVar2->SourceScriptLogId = TVar3;
  iVar4 = TTDebuggerSourceLocation::GetRootEventTime(writeLocation);
  pTVar2->EventTime = iVar4;
  iVar4 = TTDebuggerSourceLocation::GetFunctionTime(writeLocation);
  pTVar2->FunctionTime = iVar4;
  iVar4 = TTDebuggerSourceLocation::GetLoopTime(writeLocation);
  pTVar2->LoopTime = iVar4;
  uVar1 = TTDebuggerSourceLocation::GetTopLevelBodyId(writeLocation);
  pTVar2->TopLevelBodyId = uVar1;
  uVar1 = TTDebuggerSourceLocation::GetFunctionSourceLine(writeLocation);
  pTVar2->FunctionLine = uVar1;
  uVar1 = TTDebuggerSourceLocation::GetFunctionSourceColumn(writeLocation);
  pTVar2->FunctionColumn = uVar1;
  uVar1 = TTDebuggerSourceLocation::GetSourceLine(writeLocation);
  pTVar2->Line = uVar1;
  uVar1 = TTDebuggerSourceLocation::GetSourceColumn(writeLocation);
  pTVar2->Column = uVar1;
  EmitLog(this,emitUri,emitUriLength,(EventLogEntry *)local_88);
  return;
}

Assistant:

void EventLog::InnerLoopEmitLog(const TTDebuggerSourceLocation& writeLocation, const char* emitUri, size_t emitUriLength)
    {
        //Events are slab allocated with header immediately followed by payload -- we need to replicate this layout here so we allocate an array and explicitly layout.
        //See definition of GetNextAvailableEntry and GetInlineEventDataAs for more detail.
        byte buff[TTD_EVENT_PLUS_DATA_SIZE(NSLogEvents::TTDInnerLoopLogWriteEventLogEntry)];

        NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(buff);
        NSLogEvents::EventLogEntry_Initialize<NSLogEvents::EventKind::TTDInnerLoopLogWriteTag>(entry, this->m_eventTimeCtr);

        NSLogEvents::TTDInnerLoopLogWriteEventLogEntry* evt = NSLogEvents::GetInlineEventDataAs<NSLogEvents::TTDInnerLoopLogWriteEventLogEntry, NSLogEvents::EventKind::TTDInnerLoopLogWriteTag>(entry);

        evt->SourceScriptLogId = writeLocation.GetScriptLogTagId();
        evt->EventTime = writeLocation.GetRootEventTime();
        evt->FunctionTime = writeLocation.GetFunctionTime();
        evt->LoopTime = writeLocation.GetLoopTime();

        evt->TopLevelBodyId = writeLocation.GetTopLevelBodyId();
        evt->FunctionLine = writeLocation.GetFunctionSourceLine();
        evt->FunctionColumn = writeLocation.GetFunctionSourceColumn();

        evt->Line = writeLocation.GetSourceLine();
        evt->Column = writeLocation.GetSourceColumn();

        this->EmitLog(emitUri, emitUriLength, entry);
    }